

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O0

void h_predictor_64xh(uint8_t *dst,ptrdiff_t stride,uint8_t *left,int height)

{
  undefined4 uVar1;
  undefined4 local_288;
  undefined4 uStack_284;
  undefined4 uStack_280;
  undefined4 uStack_27c;
  int local_278;
  uint8_t *local_270;
  uint8_t *local_260;
  undefined1 local_228;
  undefined1 uStack_227;
  undefined1 uStack_226;
  undefined1 uStack_225;
  __m128i r3;
  __m128i r2;
  __m128i r1;
  __m128i r0;
  __m128i left4;
  int i;
  int height_local;
  uint8_t *left_local;
  ptrdiff_t stride_local;
  uint8_t *dst_local;
  
  local_278 = height >> 2;
  local_270 = left;
  local_260 = dst;
  do {
    uVar1 = *(undefined4 *)local_270;
    local_228 = (undefined1)uVar1;
    uStack_227 = (undefined1)((uint)uVar1 >> 8);
    uStack_226 = (undefined1)((uint)uVar1 >> 0x10);
    uStack_225 = (undefined1)((uint)uVar1 >> 0x18);
    local_288 = CONCAT13(local_228,CONCAT12(local_228,CONCAT11(local_228,local_228)));
    _local_288 = CONCAT17(uStack_227,
                          CONCAT16(uStack_227,CONCAT15(uStack_227,CONCAT14(uStack_227,local_288))));
    uStack_280 = CONCAT13(uStack_226,CONCAT12(uStack_226,CONCAT11(uStack_226,uStack_226)));
    _uStack_280 = CONCAT17(uStack_225,
                           CONCAT16(uStack_225,CONCAT15(uStack_225,CONCAT14(uStack_225,uStack_280)))
                          );
    *(ulong *)local_260 = CONCAT44(local_288,local_288);
    *(ulong *)(local_260 + 8) = CONCAT44(local_288,local_288);
    *(ulong *)(local_260 + 0x10) = CONCAT44(local_288,local_288);
    *(ulong *)(local_260 + 0x18) = CONCAT44(local_288,local_288);
    *(ulong *)(local_260 + 0x20) = CONCAT44(local_288,local_288);
    *(ulong *)(local_260 + 0x28) = CONCAT44(local_288,local_288);
    *(ulong *)(local_260 + 0x30) = CONCAT44(local_288,local_288);
    *(ulong *)(local_260 + 0x38) = CONCAT44(local_288,local_288);
    *(ulong *)(local_260 + stride) = CONCAT44(uStack_284,uStack_284);
    *(ulong *)(local_260 + stride + 8) = CONCAT44(uStack_284,uStack_284);
    *(ulong *)(local_260 + stride + 0x10) = CONCAT44(uStack_284,uStack_284);
    *(ulong *)(local_260 + stride + 0x10 + 8) = CONCAT44(uStack_284,uStack_284);
    *(ulong *)(local_260 + stride + 0x20) = CONCAT44(uStack_284,uStack_284);
    *(ulong *)(local_260 + stride + 0x20 + 8) = CONCAT44(uStack_284,uStack_284);
    *(ulong *)(local_260 + stride + 0x30) = CONCAT44(uStack_284,uStack_284);
    *(ulong *)(local_260 + stride + 0x30 + 8) = CONCAT44(uStack_284,uStack_284);
    *(ulong *)(local_260 + stride * 2) = CONCAT44(uStack_280,uStack_280);
    *(ulong *)(local_260 + stride * 2 + 8) = CONCAT44(uStack_280,uStack_280);
    *(ulong *)(local_260 + stride * 2 + 0x10) = CONCAT44(uStack_280,uStack_280);
    *(ulong *)(local_260 + stride * 2 + 0x18) = CONCAT44(uStack_280,uStack_280);
    *(ulong *)(local_260 + stride * 2 + 0x20) = CONCAT44(uStack_280,uStack_280);
    *(ulong *)(local_260 + stride * 2 + 0x28) = CONCAT44(uStack_280,uStack_280);
    *(ulong *)(local_260 + stride * 2 + 0x30) = CONCAT44(uStack_280,uStack_280);
    *(ulong *)(local_260 + stride * 2 + 0x38) = CONCAT44(uStack_280,uStack_280);
    *(ulong *)(local_260 + stride * 3) = CONCAT44(uStack_27c,uStack_27c);
    *(ulong *)(local_260 + stride * 3 + 8) = CONCAT44(uStack_27c,uStack_27c);
    *(ulong *)(local_260 + stride * 3 + 0x10) = CONCAT44(uStack_27c,uStack_27c);
    *(ulong *)(local_260 + stride * 3 + 0x18) = CONCAT44(uStack_27c,uStack_27c);
    *(ulong *)(local_260 + stride * 3 + 0x20) = CONCAT44(uStack_27c,uStack_27c);
    *(ulong *)(local_260 + stride * 3 + 0x28) = CONCAT44(uStack_27c,uStack_27c);
    *(ulong *)(local_260 + stride * 3 + 0x30) = CONCAT44(uStack_27c,uStack_27c);
    *(ulong *)(local_260 + stride * 3 + 0x38) = CONCAT44(uStack_27c,uStack_27c);
    local_270 = local_270 + 4;
    local_260 = local_260 + stride * 4;
    local_278 = local_278 + -1;
  } while (local_278 != 0);
  return;
}

Assistant:

static inline void h_predictor_64xh(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *left, int height) {
  int i = height >> 2;
  do {
    __m128i left4 = _mm_cvtsi32_si128(((int *)left)[0]);
    left4 = _mm_unpacklo_epi8(left4, left4);
    left4 = _mm_unpacklo_epi8(left4, left4);
    const __m128i r0 = _mm_shuffle_epi32(left4, 0x0);
    const __m128i r1 = _mm_shuffle_epi32(left4, 0x55);
    _mm_store_si128((__m128i *)dst, r0);
    _mm_store_si128((__m128i *)(dst + 16), r0);
    _mm_store_si128((__m128i *)(dst + 32), r0);
    _mm_store_si128((__m128i *)(dst + 48), r0);
    _mm_store_si128((__m128i *)(dst + stride), r1);
    _mm_store_si128((__m128i *)(dst + stride + 16), r1);
    _mm_store_si128((__m128i *)(dst + stride + 32), r1);
    _mm_store_si128((__m128i *)(dst + stride + 48), r1);
    const __m128i r2 = _mm_shuffle_epi32(left4, 0xaa);
    const __m128i r3 = _mm_shuffle_epi32(left4, 0xff);
    _mm_store_si128((__m128i *)(dst + stride * 2), r2);
    _mm_store_si128((__m128i *)(dst + stride * 2 + 16), r2);
    _mm_store_si128((__m128i *)(dst + stride * 2 + 32), r2);
    _mm_store_si128((__m128i *)(dst + stride * 2 + 48), r2);
    _mm_store_si128((__m128i *)(dst + stride * 3), r3);
    _mm_store_si128((__m128i *)(dst + stride * 3 + 16), r3);
    _mm_store_si128((__m128i *)(dst + stride * 3 + 32), r3);
    _mm_store_si128((__m128i *)(dst + stride * 3 + 48), r3);
    left += 4;
    dst += stride * 4;
  } while (--i);
}